

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diffie-hellman.c
# Opt level: O1

dh_ctx * dh_setup_group(ssh_kex *kex)

{
  char *pcVar1;
  dh_ctx *pdVar2;
  mp_int *pmVar3;
  
  pcVar1 = (char *)kex->extra;
  if (*pcVar1 != '\x01') {
    pdVar2 = (dh_ctx *)safemalloc(1,0x28,0);
    (**(code **)(pcVar1 + 8))(pdVar2);
    pmVar3 = mp_rshift_fixed(pdVar2->p,1);
    pdVar2->q = pmVar3;
    pdVar2->x = (mp_int *)0x0;
    pdVar2->e = (mp_int *)0x0;
    return pdVar2;
  }
  __assert_fail("!extra->gex",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/diffie-hellman.c"
                ,0xb3,"dh_ctx *dh_setup_group(const ssh_kex *)");
}

Assistant:

dh_ctx *dh_setup_group(const ssh_kex *kex)
{
    const struct dh_extra *extra = (const struct dh_extra *)kex->extra;
    assert(!extra->gex);
    dh_ctx *ctx = snew(dh_ctx);
    extra->construct(ctx);
    dh_init(ctx);
    return ctx;
}